

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void duckdb::ListVector::Reserve(Vector *vector,idx_t required_capacity)

{
  VectorListBuffer *this;
  
  this = (VectorListBuffer *)shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
  VectorListBuffer::Reserve(this,required_capacity);
  return;
}

Assistant:

void ListVector::Reserve(Vector &vector, idx_t required_capacity) {
	D_ASSERT(vector.GetType().id() == LogicalTypeId::LIST || vector.GetType().id() == LogicalTypeId::MAP);
	D_ASSERT(vector.GetVectorType() == VectorType::FLAT_VECTOR ||
	         vector.GetVectorType() == VectorType::CONSTANT_VECTOR);
	D_ASSERT(vector.auxiliary);
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::LIST_BUFFER);
	auto &child_buffer = vector.auxiliary->Cast<VectorListBuffer>();
	child_buffer.Reserve(required_capacity);
}